

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O0

bool __thiscall
cmCTestBuildHandler::FragmentCompare::operator()(FragmentCompare *this,string *l,string *r)

{
  cmFileTimeComparison *this_00;
  bool bVar1;
  char *f1;
  char *f2;
  int local_2c;
  string *psStack_28;
  int result;
  string *r_local;
  string *l_local;
  FragmentCompare *this_local;
  
  this_00 = this->FTC;
  psStack_28 = r;
  r_local = l;
  l_local = (string *)this;
  f1 = (char *)std::__cxx11::string::c_str();
  f2 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmFileTimeComparison::FileTimeCompare(this_00,f1,f2,&local_2c);
  if ((bVar1) && (local_2c != 0)) {
    this_local._7_1_ = local_2c < 0;
  }
  else {
    this_local._7_1_ = std::operator<(r_local,psStack_28);
  }
  return this_local._7_1_;
}

Assistant:

bool operator()(std::string const& l, std::string const& r)
    {
    // Order files by modification time.  Use lexicographic order
    // among files with the same time.
    int result;
    if(this->FTC->FileTimeCompare(l.c_str(), r.c_str(), &result) &&
       result != 0)
      {
      return result < 0;
      }
    else
      {
      return l < r;
      }
    }